

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptLexer.cpp
# Opt level: O2

String __thiscall MiniScript::Token::ToString(Token *this)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint *in_RSI;
  String SVar1;
  String local_40;
  String local_30;
  String local_20;
  
  *(undefined8 *)this = 0;
  *(undefined1 *)&(this->text).ss = 0;
  if ((ulong)*in_RSI < 0x24) {
    String::operator=((String *)this,&DAT_0014df50 + *(int *)(&DAT_0014df50 + (ulong)*in_RSI * 4));
    in_RDX = extraout_RDX;
  }
  if ((*(long *)(in_RSI + 2) != 0) && (1 < *(ulong *)(*(long *)(in_RSI + 2) + 0x18))) {
    String::operator+(&local_40,(char *)this);
    String::operator+(&local_30,&local_40);
    String::operator+(&local_20,(char *)&local_30);
    String::operator=((String *)this,&local_20);
    String::~String(&local_20);
    String::~String(&local_30);
    String::~String(&local_40);
    in_RDX = extraout_RDX_00;
  }
  SVar1._8_8_ = in_RDX;
  SVar1.ss = (StringStorage *)this;
  return SVar1;
}

Assistant:

String Token::ToString() {
		String result;
		switch (type) {
			case Token::Type::Unknown: 			result = "Unknown"; 		break;
			case Token::Type::Keyword: 			result = "Keyword"; 		break;
			case Token::Type::Number: 			result = "Number"; 			break;
			case Token::Type::String: 			result = "String"; 			break;
			case Token::Type::Identifier: 		result = "Identifier"; 		break;
			case Token::Type::OpAssign: 		result = "OpAssign"; 		break;
			case Token::Type::OpPlus: 			result = "OpPlus"; 			break;
			case Token::Type::OpMinus: 			result = "OpMinus"; 		break;
			case Token::Type::OpTimes: 			result = "OpTimes"; 		break;
			case Token::Type::OpDivide: 		result = "OpDivide"; 		break;
			case Token::Type::OpMod: 			result = "OpMod"; 			break;
			case Token::Type::OpPower: 			result = "OpPower"; 		break;
			case Token::Type::OpEqual: 			result = "OpEqual"; 		break;
			case Token::Type::OpNotEqual: 		result = "OpNotEqual"; 		break;
			case Token::Type::OpGreater: 		result = "OpGreater"; 		break;
			case Token::Type::OpGreatEqual: 	result = "OpGreatEqual";	break;
			case Token::Type::OpLesser: 		result = "OpLesser"; 		break;
			case Token::Type::OpLessEqual: 		result = "OpLessEqual"; 	break;
			case Token::Type::OpAssignPlus:		result = "OpAssignPlus";	break;
			case Token::Type::OpAssignMinus:	result = "OpAssignMinus";	break;
			case Token::Type::OpAssignTimes:	result = "OpAssignTimes";	break;
			case Token::Type::OpAssignDivide:	result = "OpAssignDivide";	break;
			case Token::Type::OpAssignMod:		result = "OpAssignMod";		break;
			case Token::Type::OpAssignPower:	result = "OpAssignPower";	break;
			case Token::Type::LParen: 			result = "LParen"; 			break;
			case Token::Type::RParen: 			result = "RParen"; 			break;
			case Token::Type::LSquare:			result = "LSquare"; 		break;
			case Token::Type::RSquare: 			result = "RSquare"; 		break;
			case Token::Type::LCurly: 			result = "LCurly"; 			break;
			case Token::Type::RCurly: 			result = "RCurly"; 			break;
			case Token::Type::AddressOf: 		result = "AddressOf"; 		break;
			case Token::Type::Comma: 			result = "Comma"; 			break;
			case Token::Type::Dot: 				result = "Dot"; 			break;
			case Token::Type::Colon: 			result = "Colon"; 			break;
			case Token::Type::Comment: 			result = "Comment"; 		break;
			case Token::Type::EOL: 				result = "EOL"; 			break;
		}
		if (!text.empty()) result = result + "(" + text + ")";
		return result;
	}